

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::traversedashwordlistdashfindnext(Forth *this)

{
  pointer pDVar1;
  uint uVar2;
  ulong uVar3;
  Cell *pCVar4;
  uint uVar5;
  uint Value;
  ulong uVar6;
  
  requireDStackDepth(this,1,"TRAVERSE-WORDLIST-FINDNEXT");
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  uVar5 = 0;
  Value = 0;
  if (uVar2 != 0) {
    uVar3 = (ulong)uVar2;
    pDVar1 = (this->definitions).
             super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->definitions).
                   super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
            -0x3333333333333333;
    Value = uVar5;
    if ((uVar3 <= uVar6 && uVar6 - uVar3 != 0) && (uVar2 - 1 != 0)) {
      uVar6 = (ulong)(uVar2 - 1);
      pCVar4 = &pDVar1[uVar6].FlagHidden;
      do {
        uVar6 = uVar6 - 1;
        if (((pCVar4[-0xc] & *pCVar4) == 0) && (pCVar4[-1] == pDVar1[uVar3].searchOrder)) {
          Value = pCVar4[-2];
          break;
        }
        pCVar4 = pCVar4 + -0x14;
      } while ((int)uVar6 != 0);
    }
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,Value);
  return;
}

Assistant:

void traversedashwordlistdashfindnext(){
					REQUIRE_DSTACK_DEPTH(1, "TRAVERSE-WORDLIST-FINDNEXT");
					auto nt = dStack.getTop(); 
					if(nt>0 && nt<definitions.size()){
						auto wid=definitions[nt].searchOrder;
						for (auto i = nt-1; i > 0 ; --i) {
							auto& defnLook = definitions[i];
							//if (!defn.isFindable())
							if (defnLook.isHidden())
								continue;
							if(defnLook.searchOrder==wid){
								dStack.setTop(defnLook.numberInVector);
								return;
							}
						}
					}
					dStack.setTop(0);	
		}